

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubjson_parser.hpp
# Opt level: O2

size_t __thiscall
jsoncons::ubjson::
basic_ubjson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::get_length(basic_ubjson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
             *this,error_code *ec)

{
  binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *this_00;
  ubjson_errc __e;
  ushort uVar1;
  uint uVar2;
  type_conflict2 tVar3;
  ulong uVar4;
  uint8_t type;
  uint8_t buf [1];
  byte bStack_1f;
  ushort uStack_1e;
  uint uStack_1c;
  
  this_00 = &this->source_;
  tVar3 = binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::read<std::random_access_iterator_tag>(this_00,&type,1);
  if (tVar3 != 0) {
    if (type == 'I') {
      tVar3 = binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::read<std::random_access_iterator_tag>(this_00,buf,2);
      if (tVar3 == 2) {
        uVar1 = CONCAT11(bStack_1f,buf[0]) << 8 | (ushort)bStack_1f;
        if (-1 < (short)uVar1) {
          return (ulong)uVar1;
        }
LAB_00613a84:
        __e = length_is_negative;
        goto LAB_00613a6b;
      }
    }
    else if (type == 'L') {
      tVar3 = binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::read<std::random_access_iterator_tag>(this_00,buf,8);
      if (tVar3 == 8) {
        uVar2 = CONCAT22(uStack_1e,CONCAT11(bStack_1f,buf[0]));
        uVar4 = (ulong)(uStack_1c >> 0x18) | (((ulong)uStack_1c & 0xff0000) << 0x20) >> 0x28 |
                (((ulong)uStack_1c & 0xff00) << 0x20) >> 0x18 |
                (((ulong)uStack_1c & 0xff) << 0x20) >> 8 | ((ulong)uVar2 & 0xff000000) << 8 |
                ((ulong)uVar2 & 0xff0000) << 0x18 | ((ulong)uVar2 & 0xff00) << 0x28 |
                CONCAT44(uStack_1c,uVar2) << 0x38;
LAB_006139ee:
        if (-1 < (long)uVar4) {
          return uVar4;
        }
        goto LAB_00613a84;
      }
    }
    else if (type == 'U') {
      tVar3 = binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::read<std::random_access_iterator_tag>(this_00,buf,1);
      if (tVar3 != 0) {
        return (ulong)buf[0];
      }
    }
    else if (type == 'l') {
      tVar3 = binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::read<std::random_access_iterator_tag>(this_00,buf,4);
      if (tVar3 == 4) {
        uVar2 = (uint)(uStack_1e >> 8) | ((uStack_1e & 0xff) << 0x10) >> 8 |
                (CONCAT11(bStack_1f,buf[0]) & 0xff00) << 8 |
                CONCAT22(uStack_1e,CONCAT11(bStack_1f,buf[0])) << 0x18;
        if (-1 < (int)uVar2) {
          return (ulong)uVar2;
        }
        goto LAB_00613a84;
      }
    }
    else {
      if (type != 'i') {
        __e = length_must_be_integer;
        goto LAB_00613a6b;
      }
      tVar3 = binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::read<std::random_access_iterator_tag>(this_00,buf,1);
      if (tVar3 == 1) {
        uVar4 = (ulong)(char)buf[0];
        goto LAB_006139ee;
      }
    }
  }
  __e = unexpected_eof;
LAB_00613a6b:
  std::error_code::operator=(ec,__e);
  this->more_ = false;
  return 0;
}

Assistant:

std::size_t get_length(std::error_code& ec)
    {
        std::size_t length = 0;
        uint8_t type;
        if (source_.read(&type, 1) == 0)
        {
            ec = ubjson_errc::unexpected_eof;
            more_ = false;
            return length;
        }
        switch (type)
        {
            case jsoncons::ubjson::ubjson_type::int8_type: 
            {
                uint8_t buf[sizeof(int8_t)];
                if (source_.read(buf, sizeof(int8_t)) != sizeof(int8_t))
                {
                    ec = ubjson_errc::unexpected_eof;
                    more_ = false;
                    return length;
                }
                int8_t val = binary::big_to_native<int8_t>(buf, sizeof(buf));
                if (val >= 0)
                {
                    length = val;
                }
                else
                {
                    ec = ubjson_errc::length_is_negative;
                    more_ = false;
                    return length;
                }
                break;
            }
            case jsoncons::ubjson::ubjson_type::uint8_type: 
            {
                uint8_t b;
                if (source_.read(&b, 1) == 0)
                {
                    ec = ubjson_errc::unexpected_eof;
                    more_ = false;
                    return length;
                }
                length = b;
                break;
            }
            case jsoncons::ubjson::ubjson_type::int16_type: 
            {
                uint8_t buf[sizeof(int16_t)];
                if (source_.read(buf, sizeof(int16_t)) != sizeof(int16_t))
                {
                    ec = ubjson_errc::unexpected_eof;
                    more_ = false;
                    return length;
                }
                int16_t val = binary::big_to_native<int16_t>(buf, sizeof(buf));
                if (val >= 0)
                {
                    length = val;
                }
                else
                {
                    ec = ubjson_errc::length_is_negative;
                    more_ = false;
                    return length;
                }
                break;
            }
            case jsoncons::ubjson::ubjson_type::int32_type: 
            {
                uint8_t buf[sizeof(int32_t)];
                if (source_.read(buf, sizeof(int32_t)) != sizeof(int32_t))
                {
                    ec = ubjson_errc::unexpected_eof;
                    more_ = false;
                    return length;
                }
                int32_t val = binary::big_to_native<int32_t>(buf, sizeof(buf));
                if (val >= 0)
                {
                    length = static_cast<std::size_t>(val);
                }
                else
                {
                    ec = ubjson_errc::length_is_negative;
                    more_ = false;
                    return length;
                }
                break;
            }
            case jsoncons::ubjson::ubjson_type::int64_type: 
            {
                uint8_t buf[sizeof(int64_t)];
                if (source_.read(buf, sizeof(int64_t)) != sizeof(int64_t))
                {
                    ec = ubjson_errc::unexpected_eof;
                    more_ = false;
                    return length;
                }
                int64_t val = binary::big_to_native<int64_t>(buf, sizeof(buf));
                if (val >= 0)
                {
                    length = (std::size_t)val;
                    if (length != (uint64_t)val)
                    {
                        ec = ubjson_errc::number_too_large;
                        more_ = false;
                        return length;
                    }
                }
                else
                {
                    ec = ubjson_errc::length_is_negative;
                    more_ = false;
                    return length;
                }
                break;
            }
            default:
            {
                ec = ubjson_errc::length_must_be_integer;
                more_ = false;
                return length;
            }
        }
        return length;
    }